

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_context.cpp
# Opt level: O0

void __thiscall duckdb::ThreadContext::ThreadContext(ThreadContext *this,ClientContext *context)

{
  LoggingContext context_00;
  bool bVar1;
  undefined1 uVar2;
  ClientContext *in_RSI;
  LoggingContext log_context;
  undefined8 in_stack_fffffffffffffed8;
  LogContextScope scope_p;
  LoggingContext *in_stack_fffffffffffffee0;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  TransactionContext *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff80 [16];
  undefined8 in_stack_ffffffffffffff90;
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *in_stack_ffffffffffffff98;
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *puVar3;
  optional_idx in_stack_ffffffffffffffa0;
  ClientContext *in_stack_ffffffffffffffa8;
  LogManager *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  
  scope_p = (LogContextScope)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  OperatorProfiler::OperatorProfiler
            ((OperatorProfiler *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true>::unique_ptr
            ((unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *)0x99d0ff);
  LoggingContext::LoggingContext(in_stack_fffffffffffffee0,scope_p);
  ClientContext::GetConnectionId(in_RSI);
  optional_idx::optional_idx
            ((optional_idx *)in_stack_ffffffffffffff20,
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  bVar1 = TransactionContext::HasActiveTransaction((TransactionContext *)0x99d15f);
  if (bVar1) {
    TransactionContext::ActiveTransaction(in_stack_ffffffffffffff20);
    optional_idx::optional_idx
              ((optional_idx *)in_stack_ffffffffffffff20,
               CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    in_stack_ffffffffffffff20 =
         (TransactionContext *)TransactionContext::GetActiveQuery(in_stack_ffffffffffffff20);
    optional_idx::optional_idx
              ((optional_idx *)in_stack_ffffffffffffff20,
               CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  }
  TaskScheduler::GetEstimatedCPUId();
  optional_idx::optional_idx
            ((optional_idx *)in_stack_ffffffffffffff20,
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  puVar3 = in_stack_ffffffffffffff98;
  uVar2 = TransactionContext::HasActiveTransaction((TransactionContext *)0x99d25e);
  if ((bool)uVar2) {
    TransactionContext::GetActiveQuery(in_stack_ffffffffffffff20);
    optional_idx::optional_idx
              ((optional_idx *)in_stack_ffffffffffffff20,CONCAT17(uVar2,in_stack_ffffffffffffff18));
  }
  shared_ptr<duckdb::DatabaseInstance,_true>::operator->
            ((shared_ptr<duckdb::DatabaseInstance,_true> *)in_stack_fffffffffffffee0);
  DatabaseInstance::GetLogManager((DatabaseInstance *)0x99d2cf);
  context_00.connection_id.index = in_stack_ffffffffffffff90;
  context_00.scope = in_stack_ffffffffffffff80[0];
  context_00._1_7_ = in_stack_ffffffffffffff80._1_7_;
  context_00.thread_id.index = in_stack_ffffffffffffff80._8_8_;
  context_00.transaction_id.index = (idx_t)puVar3;
  context_00.query_id.index = in_stack_ffffffffffffffa0.index;
  LogManager::CreateLogger
            (in_stack_ffffffffffffffb0,context_00,SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0),
             SUB81((ulong)in_stack_ffffffffffffff98 >> 0x30,0));
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true>::operator=
            (in_stack_ffffffffffffff98,local_38);
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> *)0x99d36d);
  return;
}

Assistant:

ThreadContext::ThreadContext(ClientContext &context) : profiler(context) {
	LoggingContext log_context(LogContextScope::THREAD);

	log_context.connection_id = context.GetConnectionId();
	if (context.transaction.HasActiveTransaction()) {
		log_context.transaction_id = context.transaction.ActiveTransaction().global_transaction_id;
		log_context.query_id = context.transaction.GetActiveQuery();
	}

	log_context.thread_id = TaskScheduler::GetEstimatedCPUId();
	if (context.transaction.HasActiveTransaction()) {
		log_context.transaction_id = context.transaction.GetActiveQuery();
	}
	logger = context.db->GetLogManager().CreateLogger(log_context, true);
}